

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::SeekHead::ParseEntry
               (IMkvReader *pReader,longlong start,longlong size_,Entry *pEntry)

{
  IMkvReader *pReader_00;
  long *len_00;
  long lVar1;
  longlong lVar2;
  _func_int **pp_Var3;
  IMkvReader *in_RCX;
  long in_RDX;
  long in_RSI;
  longlong seekPosSize;
  longlong seekPosId;
  longlong seekIdSize;
  longlong seekIdId;
  long len;
  longlong stop;
  longlong pos;
  long in_stack_ffffffffffffffc0;
  bool local_1;
  
  if (in_RDX < 1) {
    local_1 = false;
  }
  else {
    pReader_00 = (IMkvReader *)(in_RSI + in_RDX);
    len_00 = (long *)ReadID(in_RCX,in_RSI,(long *)pReader_00);
    if ((long)len_00 < 0) {
      local_1 = false;
    }
    else if (len_00 == (long *)0x53ab) {
      if ((long)pReader_00 < in_RSI + in_stack_ffffffffffffffc0) {
        local_1 = false;
      }
      else {
        lVar1 = in_stack_ffffffffffffffc0 + in_RSI;
        lVar2 = ReadUInt(pReader_00,in_stack_ffffffffffffffc0,(long *)0x53ab);
        if (lVar2 < 1) {
          local_1 = false;
        }
        else if ((long)pReader_00 < lVar1 + in_stack_ffffffffffffffc0) {
          local_1 = false;
        }
        else {
          lVar1 = in_stack_ffffffffffffffc0 + lVar1;
          if ((long)pReader_00 < lVar1 + lVar2) {
            local_1 = false;
          }
          else {
            pp_Var3 = (_func_int **)ReadID(in_RCX,lVar1,(long *)pReader_00);
            in_RCX->_vptr_IMkvReader = pp_Var3;
            if ((long)in_RCX->_vptr_IMkvReader < 1) {
              local_1 = false;
            }
            else if (in_stack_ffffffffffffffc0 == lVar2) {
              lVar1 = lVar2 + lVar1;
              lVar2 = ReadID(in_RCX,lVar1,(long *)pReader_00);
              if (lVar2 == 0x53ac) {
                if ((long)pReader_00 < lVar1 + in_stack_ffffffffffffffc0) {
                  local_1 = false;
                }
                else {
                  lVar1 = in_stack_ffffffffffffffc0 + lVar1;
                  lVar2 = ReadUInt(pReader_00,in_stack_ffffffffffffffc0,len_00);
                  if (lVar2 < 1) {
                    local_1 = false;
                  }
                  else if ((long)pReader_00 < lVar1 + in_stack_ffffffffffffffc0) {
                    local_1 = false;
                  }
                  else {
                    lVar1 = in_stack_ffffffffffffffc0 + lVar1;
                    if ((long)pReader_00 < lVar1 + lVar2) {
                      local_1 = false;
                    }
                    else {
                      pp_Var3 = (_func_int **)
                                UnserializeUInt(pReader_00,in_stack_ffffffffffffffc0,
                                                (longlong)len_00);
                      in_RCX[1]._vptr_IMkvReader = pp_Var3;
                      if ((long)in_RCX[1]._vptr_IMkvReader < 0) {
                        local_1 = false;
                      }
                      else if ((IMkvReader *)(lVar2 + lVar1) == pReader_00) {
                        local_1 = true;
                      }
                      else {
                        local_1 = false;
                      }
                    }
                  }
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SeekHead::ParseEntry(IMkvReader* pReader, long long start, long long size_,
                          Entry* pEntry) {
  if (size_ <= 0)
    return false;

  long long pos = start;
  const long long stop = start + size_;

  long len;

  // parse the container for the level-1 element ID

  const long long seekIdId = ReadID(pReader, pos, len);
  if (seekIdId < 0)
    return false;

  if (seekIdId != libwebm::kMkvSeekID)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume SeekID id

  const long long seekIdSize = ReadUInt(pReader, pos, len);

  if (seekIdSize <= 0)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume size of field

  if ((pos + seekIdSize) > stop)
    return false;

  pEntry->id = ReadID(pReader, pos, len);  // payload

  if (pEntry->id <= 0)
    return false;

  if (len != seekIdSize)
    return false;

  pos += seekIdSize;  // consume SeekID payload

  const long long seekPosId = ReadID(pReader, pos, len);

  if (seekPosId != libwebm::kMkvSeekPosition)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume id

  const long long seekPosSize = ReadUInt(pReader, pos, len);

  if (seekPosSize <= 0)
    return false;

  if ((pos + len) > stop)
    return false;

  pos += len;  // consume size

  if ((pos + seekPosSize) > stop)
    return false;

  pEntry->pos = UnserializeUInt(pReader, pos, seekPosSize);

  if (pEntry->pos < 0)
    return false;

  pos += seekPosSize;  // consume payload

  if (pos != stop)
    return false;

  return true;
}